

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

bool wabt::anon_unknown_0::CWriter::AreInitializersAlwaysNull(Type type)

{
  Enum EVar1;
  
  EVar1 = type.enum_;
  if (EVar1 != ExnRef) {
    if (EVar1 == FuncRef) {
      return false;
    }
    if (EVar1 != ExternRef) {
      abort();
    }
  }
  return true;
}

Assistant:

constexpr bool CWriter::AreInitializersAlwaysNull(Type type) {
  // clang-format off
  switch (type) {
    case Type::FuncRef: return false;
    case Type::ExternRef: return true;
    case Type::ExnRef: return true;
    default:
      WABT_UNREACHABLE;
  }
  // clang-format on
}